

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBRowDown2Linear_C
               (uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)dst_width;
  if (dst_width < 1) {
    uVar2 = uVar1;
  }
  for (; (int)uVar2 != (int)uVar1; uVar1 = uVar1 + 1) {
    dst_argb[uVar1 * 4] =
         (uint8_t)((uint)src_argb[uVar1 * 8] + (uint)src_argb[uVar1 * 8 + 4] + 1 >> 1);
    dst_argb[uVar1 * 4 + 1] =
         (uint8_t)((uint)src_argb[uVar1 * 8 + 1] + (uint)src_argb[uVar1 * 8 + 5] + 1 >> 1);
    dst_argb[uVar1 * 4 + 2] =
         (uint8_t)((uint)src_argb[uVar1 * 8 + 2] + (uint)src_argb[uVar1 * 8 + 6] + 1 >> 1);
    dst_argb[uVar1 * 4 + 3] =
         (uint8_t)((uint)src_argb[uVar1 * 8 + 3] + (uint)src_argb[uVar1 * 8 + 7] + 1 >> 1);
  }
  return;
}

Assistant:

void ScaleARGBRowDown2Linear_C(const uint8_t* src_argb,
                               ptrdiff_t src_stride,
                               uint8_t* dst_argb,
                               int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width; ++x) {
    dst_argb[0] = (src_argb[0] + src_argb[4] + 1) >> 1;
    dst_argb[1] = (src_argb[1] + src_argb[5] + 1) >> 1;
    dst_argb[2] = (src_argb[2] + src_argb[6] + 1) >> 1;
    dst_argb[3] = (src_argb[3] + src_argb[7] + 1) >> 1;
    src_argb += 8;
    dst_argb += 4;
  }
}